

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor
          (TPZTensor<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *input)

{
  TFad<6,_double> *pTVar1;
  int i;
  long lVar2;
  TFad<6,_double> local_60;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_018777a0;
  local_60.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_60.val_ = 0.0;
  local_60.dx_[0] = 0.0;
  local_60.dx_[1] = 0.0;
  local_60.dx_[2] = 0.0;
  local_60.dx_[3] = 0.0;
  local_60.dx_[4] = 0.0;
  local_60.dx_[5] = 0.0;
  TPZManVector<TFad<6,_double>,_6>::TPZManVector(&this->fData,6,&local_60);
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,0,0);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 != &local_60) {
    lVar2 = 2;
    do {
      pTVar1->dx_[lVar2 + -2] = local_60.dx_[lVar2 + -2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    pTVar1->val_ = local_60.val_;
  }
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,0,1);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 + 1 != &local_60) {
    lVar2 = 0;
    do {
      pTVar1[1].dx_[lVar2] = local_60.dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    pTVar1[1].val_ = local_60.val_;
  }
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,0,2);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 + 2 != &local_60) {
    lVar2 = 0;
    do {
      pTVar1[2].dx_[lVar2] = local_60.dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    pTVar1[2].val_ = local_60.val_;
  }
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,1,1);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 + 3 != &local_60) {
    lVar2 = 0;
    do {
      pTVar1[3].dx_[lVar2] = local_60.dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    pTVar1[3].val_ = local_60.val_;
  }
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,1,2);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 + 4 != &local_60) {
    lVar2 = 0;
    do {
      pTVar1[4].dx_[lVar2] = local_60.dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    pTVar1[4].val_ = local_60.val_;
  }
  (*(input->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x24])(&local_60,input,2,2);
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  if (pTVar1 + 5 != &local_60) {
    lVar2 = 0;
    do {
      pTVar1[5].dx_[lVar2] = local_60.dx_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    pTVar1[5].val_ = local_60.val_;
  }
  return;
}

Assistant:

TPZTensor(const TPZFMatrix<T> &input) : fData(6, 0.) {
#ifdef PZDEBUG
        if (input.Rows() != 3 || input.Cols() != 3) {
            DebugStop();
        }
        T tol;
        ZeroTolerance(tol);
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                if (fabs(TPZExtractVal::val(input.GetVal(i, j) - input.GetVal(j, i))) > tol) {
                    std::cout << "diff = " << input.GetVal(i, j) - input.GetVal(j, i) << std::endl;
                    DebugStop();
                }
            }
        }
#endif
        fData[_XX_] = input.GetVal(0, 0);
        fData[_XY_] = input.GetVal(0, 1);
        fData[_XZ_] = input.GetVal(0, 2);
        fData[_YY_] = input.GetVal(1, 1);
        fData[_YZ_] = input.GetVal(1, 2);
        fData[_ZZ_] = input.GetVal(2, 2);
    }